

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

bool __thiscall re2::Regexp::Walker<bool>::Walk(Walker<bool> *this,Regexp *re,bool top_arg)

{
  bool bVar1;
  
  this->max_visits_ = 1000000;
  bVar1 = WalkInternal(this,re,top_arg,true);
  return bVar1;
}

Assistant:

T Regexp::Walker<T>::Walk(Regexp* re, T top_arg) {
  // Without the exponential walking behavior,
  // this budget should be more than enough for any
  // regexp, and yet not enough to get us in trouble
  // as far as CPU time.
  max_visits_ = 1000000;
  return WalkInternal(re, top_arg, true);
}